

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

shared_ptr<tf::ChromeObserver> __thiscall
tf::Executor::make_observer<tf::ChromeObserver>(Executor *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<tf::ObserverInterface> sVar1;
  shared_ptr<tf::ChromeObserver> sVar2;
  shared_ptr<tf::ChromeObserver> sStack_28;
  
  std::make_shared<tf::ChromeObserver>();
  ChromeObserver::set_up
            ((ChromeObserver *)(this->_taskflows_mutex).super___mutex_base._M_mutex.__align,
             (*(long *)(in_RSI + 0x30) - *(long *)(in_RSI + 0x28)) / 0x980);
  sVar1 = std::static_pointer_cast<tf::ObserverInterface,tf::ChromeObserver>(&sStack_28);
  std::
  _Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<std::shared_ptr<tf::ObserverInterface>>
            ((_Hashtable<std::shared_ptr<tf::ObserverInterface>,std::shared_ptr<tf::ObserverInterface>,std::allocator<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<tf::ObserverInterface>>,std::hash<std::shared_ptr<tf::ObserverInterface>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)(in_RSI + 0x100),&sStack_28,
             sVar1.super___shared_ptr<tf::ObserverInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi._M_pi);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar2.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<tf::ChromeObserver>)
         sVar2.super___shared_ptr<tf::ChromeObserver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Observer> Executor::make_observer(ArgsT&&... args) {

  static_assert(
    std::is_base_of_v<ObserverInterface, Observer>,
    "Observer must be derived from ObserverInterface"
  );

  // use a local variable to mimic the constructor
  auto ptr = std::make_shared<Observer>(std::forward<ArgsT>(args)...);

  ptr->set_up(_workers.size());

  _observers.emplace(std::static_pointer_cast<ObserverInterface>(ptr));

  return ptr;
}